

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

ExceptionOr<capnp::Response<capnp::DynamicStruct>_> * __thiscall
kj::_::ExceptionOr<capnp::Response<capnp::DynamicStruct>_>::operator=
          (ExceptionOr<capnp::Response<capnp::DynamicStruct>_> *this,
          ExceptionOr<capnp::Response<capnp::DynamicStruct>_> *param_1)

{
  ResponseHook *pRVar1;
  Disposer *pDVar2;
  RawBrandedSchema *pRVar3;
  SegmentReader *pSVar4;
  CapTableReader *pCVar5;
  void *pvVar6;
  NullableValue<capnp::Response<capnp::DynamicStruct>_> *pNVar7;
  NullableValue<capnp::Response<capnp::DynamicStruct>_> *pNVar8;
  undefined4 uVar9;
  StructDataBitCount SVar10;
  StructPointerCount SVar11;
  undefined2 uVar12;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
      pRVar1 = (this->value).ptr.field_1.value.hook.ptr;
      if (pRVar1 != (ResponseHook *)0x0) {
        (this->value).ptr.field_1.value.hook.ptr = (ResponseHook *)0x0;
        pDVar2 = (this->value).ptr.field_1.value.hook.disposer;
        (**pDVar2->_vptr_Disposer)
                  (pDVar2,(_func_int *)
                          ((long)&pRVar1->_vptr_ResponseHook + (long)pRVar1->_vptr_ResponseHook[-2])
                  );
      }
    }
    if ((param_1->value).ptr.isSet == true) {
      pNVar7 = &(param_1->value).ptr;
      uVar9 = *(undefined4 *)((long)&pNVar7->field_1 + 0x34);
      pNVar8 = &(this->value).ptr;
      *(int *)((long)&pNVar8->field_1 + 0x30) = *(int *)((long)&pNVar7->field_1 + 0x30);
      *(undefined4 *)((long)&pNVar8->field_1 + 0x34) = uVar9;
      pRVar3 = (param_1->value).ptr.field_1.value.super_Reader.schema.super_Schema.raw;
      pSVar4 = (param_1->value).ptr.field_1.value.super_Reader.reader.segment;
      pCVar5 = (param_1->value).ptr.field_1.value.super_Reader.reader.capTable;
      pvVar6 = (param_1->value).ptr.field_1.value.super_Reader.reader.data;
      pNVar7 = &(param_1->value).ptr;
      SVar10 = *(StructDataBitCount *)((long)&pNVar7->field_1 + 0x28);
      SVar11 = *(StructPointerCount *)((long)&pNVar7->field_1 + 0x2c);
      uVar12 = *(undefined2 *)((long)&pNVar7->field_1 + 0x2e);
      (this->value).ptr.field_1.value.super_Reader.reader.pointers =
           (param_1->value).ptr.field_1.value.super_Reader.reader.pointers;
      pNVar7 = &(this->value).ptr;
      *(StructDataBitCount *)((long)&pNVar7->field_1 + 0x28) = SVar10;
      *(StructPointerCount *)((long)&pNVar7->field_1 + 0x2c) = SVar11;
      *(undefined2 *)((long)&pNVar7->field_1 + 0x2e) = uVar12;
      (this->value).ptr.field_1.value.super_Reader.reader.capTable = pCVar5;
      (this->value).ptr.field_1.value.super_Reader.reader.data = pvVar6;
      (this->value).ptr.field_1.value.super_Reader.schema.super_Schema.raw = pRVar3;
      (this->value).ptr.field_1.value.super_Reader.reader.segment = pSVar4;
      (this->value).ptr.field_1.value.hook.disposer =
           (param_1->value).ptr.field_1.value.hook.disposer;
      (this->value).ptr.field_1.value.hook.ptr = (param_1->value).ptr.field_1.value.hook.ptr;
      (param_1->value).ptr.field_1.value.hook.ptr = (ResponseHook *)0x0;
      (this->value).ptr.isSet = true;
    }
  }
  if ((param_1->value).ptr.isSet == true) {
    (param_1->value).ptr.isSet = false;
    pRVar1 = (param_1->value).ptr.field_1.value.hook.ptr;
    if (pRVar1 != (ResponseHook *)0x0) {
      (param_1->value).ptr.field_1.value.hook.ptr = (ResponseHook *)0x0;
      pDVar2 = (param_1->value).ptr.field_1.value.hook.disposer;
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(_func_int *)
                        ((long)&pRVar1->_vptr_ResponseHook + (long)pRVar1->_vptr_ResponseHook[-2]));
    }
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;